

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O1

SharedPtr<vkt::Draw::Image> __thiscall
vkt::Draw::Image::create
          (Image *this,DeviceInterface *vk,VkDevice device,VkImageCreateInfo *createInfo)

{
  VkFormat VVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  Allocation *pAVar4;
  undefined8 *puVar5;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  SharedPtrStateBase *pSVar6;
  SharedPtr<vkt::Draw::Image> SVar7;
  Move<vk::Handle<(vk::HandleType)9>_> local_58;
  
  pAVar4 = (Allocation *)operator_new(0x70);
  VVar1 = createInfo->format;
  dVar2 = createInfo->mipLevels;
  dVar3 = createInfo->arrayLayers;
  ::vk::createImage(&local_58,vk,device,createInfo,(VkAllocationCallbacks *)0x0);
  pAVar4->_vptr_Allocation = (_func_int **)0x0;
  pAVar4[1]._vptr_Allocation =
       (_func_int **)local_58.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
  pAVar4[1].m_memory.m_internal =
       (deUint64)local_58.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  pAVar4->m_offset = local_58.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
  ;
  pAVar4->m_hostPtr =
       local_58.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface;
  local_58.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  local_58.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_58.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_58.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  *(VkFormat *)&pAVar4[1].m_offset = VVar1;
  *(undefined8 *)((long)&pAVar4[1].m_offset + 4) = *(undefined8 *)&createInfo->extent;
  *(deUint32 *)((long)&pAVar4[1].m_hostPtr + 4) = (createInfo->extent).depth;
  *(deUint32 *)&pAVar4[2]._vptr_Allocation = dVar2;
  *(deUint32 *)((long)&pAVar4[2]._vptr_Allocation + 4) = dVar3;
  pAVar4[2].m_memory.m_internal = 0;
  pAVar4[2].m_offset = 0;
  pAVar4[2].m_hostPtr = (void *)0x0;
  pAVar4[3]._vptr_Allocation = (_func_int **)vk;
  pAVar4[3].m_memory.m_internal = (deUint64)device;
  (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
  ptr = (Allocation *)0x0;
  *(undefined8 *)
   &(this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.field_0x8 = 0;
  (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
  ptr = pAVar4;
  puVar5 = (undefined8 *)operator_new(0x20);
  *(undefined4 *)(puVar5 + 1) = 0;
  *(undefined4 *)((long)puVar5 + 0xc) = 0;
  *puVar5 = &PTR__SharedPtrState_00d60f28;
  puVar5[2] = pAVar4;
  *(undefined8 **)
   &(this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.field_0x8 = puVar5;
  *(undefined4 *)(puVar5 + 1) = 1;
  *(undefined4 *)((long)puVar5 + 0xc) = 1;
  pSVar6 = extraout_RDX;
  if (local_58.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&local_58.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)local_58.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                        m_internal);
    pSVar6 = extraout_RDX_00;
  }
  SVar7.m_state = pSVar6;
  SVar7.m_ptr = this;
  return SVar7;
}

Assistant:

de::SharedPtr<Image> Image::create(const vk::DeviceInterface&	vk,
								   vk::VkDevice					device,
								   const vk::VkImageCreateInfo	&createInfo)
{
	return de::SharedPtr<Image>(new Image(vk, device, createInfo.format, createInfo.extent,
								createInfo.mipLevels, createInfo.arrayLayers,
								vk::createImage(vk, device, &createInfo)));
}